

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::PointRenderCase::verifyWidePointAt
          (PointRenderCase *this,IVec2 *pointPos,Surface *viewport,GeneratedPoint *refPoint,
          IVec4 *bbox,ResultPointType pointType,int componentNdx,int *logFloodCounter)

{
  ostringstream *this_00;
  uint expectedPointSize;
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  int *piVar5;
  ulong uVar6;
  float fVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> widthsUpwards;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> widthsDownwards;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> widths;
  Vector<float,_2> local_228;
  IVec2 *local_220;
  int *local_218;
  int *piStack_210;
  long local_208;
  void *local_1f8;
  void *pvStack_1f0;
  long local_1e8;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> local_1d8;
  GeneratedPoint *local_1c0;
  PointRenderCase *local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  expectedPointSize = refPoint->size;
  local_208 = 0;
  local_218 = (int *)0x0;
  piStack_210 = (int *)0x0;
  local_1e8 = 0;
  local_1f8 = (void *)0x0;
  pvStack_1f0 = (void *)0x0;
  local_1d8.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  fVar7 = (float)pointPos->m_data[1];
  bVar4 = (int)fVar7 < bbox->m_data[1];
  local_220 = pointPos;
  local_1c0 = refPoint;
  local_1b8 = this;
  if ((int)fVar7 < 0 || bVar4) {
    bVar11 = SUB41((uint)fVar7 >> 0x1f,0);
  }
  else {
    iVar8 = -(int)fVar7;
    do {
      if ((int)expectedPointSize < local_220->m_data[1] + iVar8) {
LAB_01682713:
        bVar4 = false;
        bVar11 = false;
        break;
      }
      local_228.m_data[0] =
           *(float *)((long)(viewport->m_pixels).m_ptr +
                     (long)(viewport->m_width * (int)fVar7 + local_220->m_data[0]) * 4);
      tcu::RGBA::toIVec((RGBA *)local_1b0);
      if (*(int *)(local_1b0 + (long)componentNdx * 4) == 0) goto LAB_01682713;
      local_228.m_data[1] = fVar7;
      local_228.m_data[0] = (float)local_220->m_data[0];
      scanPointWidthAt((PointRenderCase *)local_1b0,(IVec2 *)&local_228,viewport,expectedPointSize,
                       componentNdx);
      std::vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>>::
      emplace_back<tcu::Vector<int,2>>
                ((vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>> *)&local_218,
                 (Vector<int,_2> *)local_1b0);
      bVar4 = (int)fVar7 <= bbox->m_data[1];
      bVar11 = (int)fVar7 < 1;
      if ((int)fVar7 < 1) break;
      iVar8 = iVar8 + 1;
      bVar3 = bbox->m_data[1] < (int)fVar7;
      fVar7 = (float)((int)fVar7 + -1);
    } while (bVar3);
  }
  if (((byte)(pointType == POINT_PARTIAL & bVar4 | bVar11) == 1) && (local_218 != piStack_210)) {
    if (pointType == POINT_PARTIAL) {
      bVar4 = true;
      if (bbox->m_data[0] < piStack_210[-2]) {
        bVar4 = bbox->m_data[2] <= piStack_210[-1];
      }
    }
    else {
      bVar4 = false;
    }
    bVar11 = true;
    if (((int)expectedPointSize <= (piStack_210[-1] - piStack_210[-2]) + 1) || (bVar4))
    goto LAB_01682b92;
  }
  fVar7 = (float)(local_220->m_data[1] + 1);
  iVar8 = bbox->m_data[3];
  if (((int)fVar7 < iVar8) && ((int)fVar7 < viewport->m_height)) {
    bVar4 = true;
    do {
      if ((int)expectedPointSize < (int)fVar7 - local_220->m_data[1]) {
        bVar11 = true;
        goto LAB_01682858;
      }
      local_228.m_data[0] =
           *(float *)((long)(viewport->m_pixels).m_ptr +
                     (long)(viewport->m_width * (int)fVar7 + local_220->m_data[0]) * 4);
      tcu::RGBA::toIVec((RGBA *)local_1b0);
      bVar11 = true;
      if (*(int *)(local_1b0 + (long)componentNdx * 4) == 0) goto LAB_01682858;
      local_228.m_data[1] = fVar7;
      local_228.m_data[0] = (float)local_220->m_data[0];
      scanPointWidthAt((PointRenderCase *)local_1b0,(IVec2 *)&local_228,viewport,expectedPointSize,
                       componentNdx);
      std::vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>>::
      emplace_back<tcu::Vector<int,2>>
                ((vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>> *)&local_1f8,
                 (Vector<int,_2> *)local_1b0);
      fVar7 = (float)((int)fVar7 + 1);
      iVar8 = bbox->m_data[3];
    } while (((int)fVar7 < iVar8) && ((int)fVar7 < viewport->m_height));
  }
  bVar4 = (int)fVar7 < iVar8;
  bVar11 = (int)fVar7 < viewport->m_height;
LAB_01682858:
  if ((!bVar11) || (pointType == POINT_PARTIAL && !bVar4)) {
    if (local_1f8 == pvStack_1f0) {
      if (local_218 == piStack_210) goto LAB_016828f7;
      piVar5 = local_218;
      if (local_1f8 != pvStack_1f0) goto LAB_0168287c;
    }
    else {
LAB_0168287c:
      piVar5 = (int *)((long)pvStack_1f0 + -8);
    }
    iVar8 = *piVar5;
    iVar12 = piVar5[1];
    if (pointType == POINT_PARTIAL) {
      bVar4 = true;
      if (bbox->m_data[0] < iVar8) {
        bVar4 = bbox->m_data[2] + -1 <= iVar12;
      }
    }
    else {
      bVar4 = false;
    }
    bVar11 = true;
    if (((((int)expectedPointSize <= (iVar12 - iVar8) + 1) || (bVar4)) || (iVar8 < 1)) ||
       (viewport->m_width + -1 <= iVar12)) goto LAB_01682b92;
  }
LAB_016828f7:
  uVar6 = (ulong)((long)piStack_210 - (long)local_218) >> 3;
  if (0 < (int)uVar6) {
    iVar8 = 0;
    iVar12 = -1;
    do {
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                (&local_1d8,(value_type *)(local_218 + (long)((int)uVar6 + iVar12) * 2));
      iVar8 = iVar8 + 1;
      uVar6 = (ulong)((long)piStack_210 - (long)local_218) >> 3;
      iVar12 = iVar12 + -1;
    } while (iVar8 < (int)uVar6);
  }
  if (0 < (int)((ulong)((long)pvStack_1f0 - (long)local_1f8) >> 3)) {
    lVar13 = 0;
    lVar14 = 0;
    do {
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                (&local_1d8,(value_type *)((long)local_1f8 + lVar13));
      lVar14 = lVar14 + 1;
      lVar13 = lVar13 + 8;
    } while (lVar14 < (int)((ulong)((long)pvStack_1f0 - (long)local_1f8) >> 3));
  }
  uVar9 = (int)((ulong)((long)local_1d8.
                              super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_1d8.
                             super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) - expectedPointSize;
  if (uVar9 < 0x7fffffff) {
    uVar9 = uVar9 + 1;
    uVar6 = 1;
    if (1 < (int)uVar9) {
      uVar6 = (ulong)uVar9;
    }
    uVar10 = 0;
    lVar13 = 0x100000000;
    do {
      iVar8 = local_1d8.
              super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl
              .super__Vector_impl_data._M_start[uVar10].m_data[0];
      iVar12 = local_1d8.
               super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar10].m_data[1];
      lVar14 = lVar13;
      lVar15 = (ulong)expectedPointSize - 1;
      if (1 < (int)expectedPointSize) {
        do {
          iVar1 = *(int *)((long)(local_1d8.
                                  super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data +
                          (lVar14 >> 0x1d));
          iVar2 = *(int *)((long)(local_1d8.
                                  super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data +
                          (lVar14 >> 0x1d) + 4);
          if (iVar8 <= iVar1) {
            iVar8 = iVar1;
          }
          if (iVar2 <= iVar12) {
            iVar12 = iVar2;
          }
          lVar14 = lVar14 + 0x100000000;
          lVar15 = lVar15 + -1;
        } while (lVar15 != 0);
      }
      bVar11 = true;
      if ((((int)expectedPointSize <= (iVar12 - iVar8) + 1) ||
          (pointType == POINT_PARTIAL &&
           (bbox->m_data[2] + -1 <= iVar12 || iVar8 <= bbox->m_data[0]))) ||
         ((iVar8 < 1 || (viewport->m_width + -1 <= iVar12)))) goto LAB_01682b92;
      uVar10 = uVar10 + 1;
      lVar13 = lVar13 + 0x100000000;
    } while (uVar10 != uVar6);
  }
  *logFloodCounter = *logFloodCounter + -1;
  if (-1 < *logFloodCounter) {
    local_1b0._0_8_ =
         ((local_1b8->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
         ->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Missing ",8);
    std::ostream::operator<<(this_00,expectedPointSize);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"x",1);
    std::ostream::operator<<(this_00,expectedPointSize);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," point near ",0xc);
    tcu::operator<<((ostream *)this_00,local_220);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,", vertex coordinates=",0x15);
    local_228.m_data = *&(local_1c0->center).m_data;
    tcu::operator<<((ostream *)this_00,&local_228);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,".",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
  }
  bVar11 = false;
LAB_01682b92:
  if (local_1d8.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.
                    super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d8.
                          super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.
                          super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1f8 != (void *)0x0) {
    operator_delete(local_1f8,local_1e8 - (long)local_1f8);
  }
  if (local_218 != (int *)0x0) {
    operator_delete(local_218,local_208 - (long)local_218);
  }
  return bVar11;
}

Assistant:

bool PointRenderCase::verifyWidePointAt (const tcu::IVec2& pointPos, const tcu::Surface& viewport, const GeneratedPoint& refPoint, const tcu::IVec4& bbox, ResultPointType pointType, int componentNdx, int& logFloodCounter)
{
	const int				expectedPointSize		= refPoint.size;
	bool					viewportClippedTop		= false;
	bool					viewportClippedBottom	= false;
	bool					primitiveClippedTop		= false;
	bool					primitiveClippedBottom	= false;
	std::vector<tcu::IVec2>	widthsUpwards;
	std::vector<tcu::IVec2>	widthsDownwards;
	std::vector<tcu::IVec2>	widths;

	// search upwards
	for (int y = pointPos.y();; --y)
	{
		if (y < bbox.y() || y < 0)
		{
			if (y < bbox.y())
				primitiveClippedTop = true;
			if (y < 0)
				viewportClippedTop = true;
			break;
		}
		else if (pointPos.y() - y > expectedPointSize)
		{
			// no need to go further than point height
			break;
		}
		else if (viewport.getPixel(pointPos.x(), y).toIVec()[componentNdx] == 0)
		{
			break;
		}
		else
		{
			widthsUpwards.push_back(scanPointWidthAt(tcu::IVec2(pointPos.x(), y), viewport, expectedPointSize, componentNdx));
		}
	}

	// top is clipped
	if ((viewportClippedTop || (pointType == POINT_PARTIAL && primitiveClippedTop)) && !widthsUpwards.empty())
	{
		const tcu::IVec2&	range			= widthsUpwards.back();
		const bool			squareFits		= (range.y() - range.x() + 1) >= expectedPointSize;
		const bool			widthClipped	= (pointType == POINT_PARTIAL) && (range.x() <= bbox.x() || range.y() >= bbox.z());

		if (squareFits || widthClipped)
			return true;
	}

	// and downwards
	for (int y = pointPos.y()+1;; ++y)
	{
		if (y >= bbox.w() || y >= viewport.getHeight())
		{
			if (y >= bbox.w())
				primitiveClippedBottom = true;
			if (y >= viewport.getHeight())
				viewportClippedBottom = true;
			break;
		}
		else if (y - pointPos.y() > expectedPointSize)
		{
			// no need to go further than point height
			break;
		}
		else if (viewport.getPixel(pointPos.x(), y).toIVec()[componentNdx] == 0)
		{
			break;
		}
		else
		{
			widthsDownwards.push_back(scanPointWidthAt(tcu::IVec2(pointPos.x(), y), viewport, expectedPointSize, componentNdx));
		}
	}

	// bottom is clipped
	if ((viewportClippedBottom || (pointType == POINT_PARTIAL && primitiveClippedBottom)) && !(widthsDownwards.empty() && widthsUpwards.empty()))
	{
		const tcu::IVec2&	range			= (widthsDownwards.empty()) ? (widthsUpwards.front()) : (widthsDownwards.back());
		const bool			squareFits		= (range.y() - range.x() + 1) >= expectedPointSize;
		const bool			bboxClipped		= (pointType == POINT_PARTIAL) && (range.x() <= bbox.x() || range.y() >= bbox.z()-1);
		const bool			viewportClipped	= range.x() <= 0 || range.y() >= viewport.getWidth()-1;

		if (squareFits || bboxClipped || viewportClipped)
			return true;
	}

	// would square point would fit into the rasterized area

	for (int ndx = 0; ndx < (int)widthsUpwards.size(); ++ndx)
		widths.push_back(widthsUpwards[(int)widthsUpwards.size() - ndx - 1]);
	for (int ndx = 0; ndx < (int)widthsDownwards.size(); ++ndx)
		widths.push_back(widthsDownwards[ndx]);
	DE_ASSERT(!widths.empty());

	for (int y = 0; y < (int)widths.size() - expectedPointSize + 1; ++y)
	{
		tcu::IVec2 unionRange = widths[y];

		for (int dy = 1; dy < expectedPointSize; ++dy)
		{
			unionRange.x() = de::max(unionRange.x(), widths[y+dy].x());
			unionRange.y() = de::min(unionRange.y(), widths[y+dy].y());
		}

		// would a N x N block fit here?
		{
			const bool squareFits		= (unionRange.y() - unionRange.x() + 1) >= expectedPointSize;
			const bool bboxClipped		= (pointType == POINT_PARTIAL) && (unionRange.x() <= bbox.x() || unionRange.y() >= bbox.z()-1);
			const bool viewportClipped	= unionRange.x() <= 0 || unionRange.y() >= viewport.getWidth()-1;

			if (squareFits || bboxClipped || viewportClipped)
				return true;
		}
	}

	if (--logFloodCounter >= 0)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Missing " << expectedPointSize << "x" << expectedPointSize << " point near " << pointPos << ", vertex coordinates=" << refPoint.center.swizzle(0, 1) << "."
			<< tcu::TestLog::EndMessage;
	}
	return false;
}